

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawDoubleSky1PalCommand::Execute(DrawDoubleSky1PalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  byte bVar20;
  byte *pbVar21;
  
  iVar1 = (this->super_PalSkyCommand)._count;
  iVar15 = (this->super_PalSkyCommand).super_DrawerCommand._dest_y;
  iVar10 = thread->pass_end_y - iVar15;
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  if (iVar1 < iVar10) {
    iVar10 = iVar1;
  }
  uVar19 = thread->pass_start_y - iVar15;
  if ((int)uVar19 < 1) {
    uVar19 = 0;
  }
  iVar1 = thread->num_cores;
  iVar15 = (iVar1 - (int)((iVar15 + uVar19) - thread->core) % iVar1) % iVar1;
  uVar8 = (long)(int)((~uVar19 + iVar1 + iVar10) - iVar15) / (long)iVar1;
  uVar9 = uVar8 & 0xffffffff;
  if (0 < (int)uVar8) {
    puVar6 = (this->super_PalSkyCommand)._source[0];
    puVar7 = (this->super_PalSkyCommand)._source2[0];
    iVar10 = (this->super_PalSkyCommand)._sourceheight[0];
    uVar11 = (this->super_PalSkyCommand)._sourceheight[1] - 1;
    uVar2 = *(uint *)&(this->super_PalSkyCommand).super_DrawerCommand.field_0xc;
    uVar3 = (this->super_PalSkyCommand).solid_bottom;
    iVar4 = (this->super_PalSkyCommand)._pitch;
    iVar15 = iVar15 + uVar19;
    pbVar21 = (this->super_PalSkyCommand)._dest + iVar4 * iVar15;
    uVar5 = (this->super_PalSkyCommand)._iscale[0];
    uVar19 = iVar15 * uVar5 + (this->super_PalSkyCommand)._texturefrac[0];
    iVar16 = uVar5 * iVar1;
    iVar15 = 0x2000000 - uVar19;
    do {
      uVar12 = (uVar19 >> 8 & 0xffff) * iVar10 >> 0x10;
      bVar20 = puVar6[uVar12];
      if (bVar20 == 0) {
        if (uVar11 <= uVar12) {
          uVar12 = uVar11;
        }
        bVar20 = puVar7[uVar12];
      }
      iVar13 = (int)uVar19 >> 0xe;
      iVar17 = iVar15 >> 0xe;
      if ((iVar13 < 0x100) || (iVar17 < 0x100)) {
        if (0xff < iVar17) {
          iVar17 = 0x100;
        }
        if (iVar17 < 1) {
          iVar17 = 0;
        }
        if (0xff < iVar13) {
          iVar13 = 0x100;
        }
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        iVar18 = 0x100 - iVar13;
        iVar14 = 0x100 - iVar17;
        bVar20 = RGB32k.All
                 [(ulong)(iVar14 * (uVar3 & 0xff) +
                          (iVar18 * (uVar2 & 0xff) +
                           (uint)GPalette.BaseColors[bVar20].field_0.field_0.b * iVar13 >> 8) *
                          iVar17 >> 0xb) +
                  (ulong)(iVar14 * (uVar3 >> 8 & 0xff) +
                          (iVar18 * (uVar2 >> 8 & 0xff) +
                           (uint)GPalette.BaseColors[bVar20].field_0.field_0.g * iVar13 >> 8) *
                          iVar17 >> 6 & 0xffffffe0) +
                  (ulong)(iVar14 * (uVar3 >> 0x10 & 0xff) +
                          (iVar18 * (uVar2 >> 0x10 & 0xff) +
                           (uint)GPalette.BaseColors[bVar20].field_0.field_0.r * iVar13 >> 8) *
                          iVar17 >> 1 & 0x7fc00)];
      }
      *pbVar21 = bVar20;
      uVar19 = uVar19 + iVar16;
      pbVar21 = pbVar21 + iVar4 * iVar1;
      iVar15 = iVar15 - iVar16;
      uVar12 = (int)uVar9 - 1;
      uVar9 = (ulong)uVar12;
    } while (uVar12 != 0);
  }
  return;
}

Assistant:

void DrawDoubleSky1PalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *dest = _dest;
		int count = _count;
		int pitch = _pitch;
		const uint8_t *source0 = _source[0];
		const uint8_t *source1 = _source2[0];
		int textureheight0 = _sourceheight[0];
		uint32_t maxtextureheight1 = _sourceheight[1] - 1;

		int32_t frac = _texturefrac[0];
		int32_t fracstep = _iscale[0];

		int start_fade = 2; // How fast it should fade out

		int solid_top_r = RPART(solid_top);
		int solid_top_g = GPART(solid_top);
		int solid_top_b = BPART(solid_top);
		int solid_bottom_r = RPART(solid_bottom);
		int solid_bottom_g = GPART(solid_bottom);
		int solid_bottom_b = BPART(solid_bottom);

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int skipped = thread->skipped_by_thread(_dest_y);
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * skipped;
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		for (int index = 0; index < count; index++)
		{
			uint32_t sample_index = (((((uint32_t)frac) << 8) >> FRACBITS) * textureheight0) >> FRACBITS;
			uint8_t fg = source0[sample_index];
			if (fg == 0)
			{
				uint32_t sample_index2 = MIN(sample_index, maxtextureheight1);
				fg = source1[sample_index2];
			}

			int alpha_top = MAX(MIN(frac >> (16 - start_fade), 256), 0);
			int alpha_bottom = MAX(MIN(((2 << 24) - frac) >> (16 - start_fade), 256), 0);

			if (alpha_top == 256 && alpha_bottom == 256)
			{
				*dest = fg;
			}
			else
			{
				int inv_alpha_top = 256 - alpha_top;
				int inv_alpha_bottom = 256 - alpha_bottom;

				const auto &c = GPalette.BaseColors[fg];
				int c_red = c.r;
				int c_green = c.g;
				int c_blue = c.b;
				c_red = (c_red * alpha_top + solid_top_r * inv_alpha_top) >> 8;
				c_green = (c_green * alpha_top + solid_top_g * inv_alpha_top) >> 8;
				c_blue = (c_blue * alpha_top + solid_top_b * inv_alpha_top) >> 8;
				c_red = (c_red * alpha_bottom + solid_bottom_r * inv_alpha_bottom) >> 8;
				c_green = (c_green * alpha_bottom + solid_bottom_g * inv_alpha_bottom) >> 8;
				c_blue = (c_blue * alpha_bottom + solid_bottom_b * inv_alpha_bottom) >> 8;
				*dest = RGB32k.RGB[(c_red >> 3)][(c_green >> 3)][(c_blue >> 3)];
			}

			frac += fracstep;
			dest += pitch;
		}
	}